

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialFormat.cpp
# Opt level: O0

bool IsCpcSpeedlockTrack(Track *track,int *weak_offset,int *weak_size)

{
  bool bVar1;
  uint16_t uVar2;
  int iVar3;
  uchar *puVar4;
  uchar *puVar5;
  const_reference pvVar6;
  CRC16 local_4a;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_48;
  Data *data7;
  Data *data0;
  Sector *sector7;
  Sector *sector0;
  int *weak_size_local;
  int *weak_offset_local;
  Track *track_local;
  
  sector0 = (Sector *)weak_size;
  weak_size_local = weak_offset;
  weak_offset_local = &track->tracklen;
  iVar3 = Track::size(track);
  if (iVar3 == 9) {
    sector7 = Track::operator[]((Track *)weak_offset_local,0);
    data0 = (Data *)Track::operator[]((Track *)weak_offset_local,7);
    if ((((((sector7->encoding == MFM) && (((Sector *)data0)->encoding == MFM)) &&
          (sector7->datarate == _250K)) &&
         ((((Sector *)data0)->datarate == _250K && (iVar3 = Sector::size(sector7), iVar3 == 0x200)))
         ) && ((iVar3 = Sector::size((Sector *)data0), iVar3 == 0x200 &&
               ((iVar3 = Sector::data_size(sector7), 0x1ff < iVar3 &&
                (iVar3 = Sector::data_size((Sector *)data0), 0x1ff < iVar3)))))) &&
       (bVar1 = Sector::has_baddatacrc((Sector *)data0), bVar1)) {
      data7 = Sector::data_copy(sector7,0);
      local_48 = &Sector::data_copy((Sector *)data0,0)->
                  super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
      puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         (&data7->super_vector<unsigned_char,_std::allocator<unsigned_char>_>);
      iVar3 = memcmp(puVar4 + 0x101,"SPEEDLOCK",9);
      if (iVar3 != 0) {
        puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           (&data7->super_vector<unsigned_char,_std::allocator<unsigned_char>_>);
        iVar3 = memcmp(puVar4 + 0x81,"SPEEDLOCK",9);
        if (iVar3 != 0) {
          puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             (&data7->super_vector<unsigned_char,_std::allocator<unsigned_char>_>);
          iVar3 = memcmp(puVar4 + 0xd0,"J",0xc);
          bVar1 = true;
          if (iVar3 == 0) {
            puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               (&data7->super_vector<unsigned_char,_std::allocator<unsigned_char>_>)
            ;
            CRC16::CRC16(&local_4a,puVar4 + 0x31,0xab,0xffff);
            uVar2 = CRC16::operator_cast_to_unsigned_short(&local_4a);
            bVar1 = uVar2 != 0x62c2;
          }
          if (bVar1) {
            return false;
          }
        }
      }
      puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_48);
      puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_48);
      iVar3 = Sector::size((Sector *)data0);
      iVar3 = memcmp(puVar4,puVar5 + 1,(long)(iVar3 / 2 + -1));
      if (iVar3 == 0) {
        pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (&data7->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,0x81
                           );
        if (*pvVar6 == 'S') {
          *weak_size_local = 0x100;
          (sector0->header).cyl = 0x100;
        }
        else {
          *weak_size_local = 0x150;
          (sector0->header).cyl = 0x20;
        }
      }
      else {
        *weak_size_local = 0;
        (sector0->header).cyl = 0x200;
      }
      if (opt.debug != 0) {
        util::operator<<((LogHelper *)&util::cout,(char (*) [30])"detected CPC Speedlock track\n");
      }
      track_local._7_1_ = true;
    }
    else {
      track_local._7_1_ = false;
    }
  }
  else {
    track_local._7_1_ = false;
  }
  return track_local._7_1_;
}

Assistant:

bool IsCpcSpeedlockTrack(const Track& track, int& weak_offset, int& weak_size)
{
    if (track.size() != 9)
        return false;

    auto& sector0 = track[0];
    auto& sector7 = track[7];

    if (sector0.encoding != Encoding::MFM || sector7.encoding != Encoding::MFM ||
        sector0.datarate != DataRate::_250K || sector7.datarate != DataRate::_250K ||
        sector0.size() != 512 || sector7.size() != 512 ||
        sector0.data_size() < 512 || sector7.data_size() < 512 ||
        !sector7.has_baddatacrc())  // weak sector
        return false;

    auto& data0 = sector0.data_copy();
    auto& data7 = sector7.data_copy();

    // Check for signature in the boot sector
    if (memcmp(data0.data() + 257, "SPEEDLOCK", 9) && memcmp(data0.data() + 129, "SPEEDLOCK", 9))
    {
        // If that's missing, look for a code signature
        if (memcmp(data0.data() + 208, "\x4a\x00\x09\x46\x00\x00\x00\x42\x02\x47\x2a\xff", 12) ||
            CRC16(data0.data() + 49, 220 - 49) != 0x62c2)
            return false;
    }

    // If there's no common block at the start, assume fully random
    // Buggy Boy has only 255, so don't check the full first half!
    if (memcmp(data7.data(), data7.data() + 1, (sector7.size() / 2) - 1))
    {
        // -512
        weak_offset = 0;
        weak_size = 512;
    }
    else if (data0[129] == 'S')
    {
        // =256 -256
        weak_offset = 256;
        weak_size = 256;
    }
    else
    {
        // =256 -33 +47 -176
        weak_offset = 336;
        weak_size = 32;
    }

    if (opt.debug) util::cout << "detected CPC Speedlock track\n";
    return true;
}